

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

WasmScriptFunction * __thiscall
Js::JavascriptLibrary::CreateWasmScriptFunction(JavascriptLibrary *this,FunctionProxy *proxy)

{
  code *pcVar1;
  bool bVar2;
  FunctionInfo *pFVar3;
  undefined4 *puVar4;
  Recycler *pRVar5;
  WasmScriptFunction *this_00;
  InfoBitsWrapper<(Memory::ObjectInfoBits)1> local_49;
  TrackAllocData local_48;
  ScriptFunctionType *local_20;
  ScriptFunctionType *deferredPrototypeType;
  FunctionProxy *proxy_local;
  JavascriptLibrary *this_local;
  
  deferredPrototypeType = (ScriptFunctionType *)proxy;
  proxy_local = (FunctionProxy *)this;
  pFVar3 = FunctionProxy::GetFunctionInfo(proxy);
  bVar2 = FunctionInfo::HasComputedName(pFVar3);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1903,"(!proxy->GetFunctionInfo()->HasComputedName())",
                                "!proxy->GetFunctionInfo()->HasComputedName()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pFVar3 = FunctionProxy::GetFunctionInfo((FunctionProxy *)deferredPrototypeType);
  bVar2 = FunctionInfo::HasHomeObj(pFVar3);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1904,"(!proxy->GetFunctionInfo()->HasHomeObj())",
                                "!proxy->GetFunctionInfo()->HasHomeObj()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  local_20 = FunctionProxy::EnsureDeferredPrototypeType((FunctionProxy *)deferredPrototypeType);
  pRVar5 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&WasmScriptFunction::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x1906);
  pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_48);
  this_00 = (WasmScriptFunction *)new<(Memory::ObjectInfoBits)1>(0x58,pRVar5,&local_49);
  WasmScriptFunction::WasmScriptFunction(this_00,(FunctionProxy *)deferredPrototypeType,local_20);
  return this_00;
}

Assistant:

WasmScriptFunction * JavascriptLibrary::CreateWasmScriptFunction(FunctionProxy* proxy)
    {
        Assert(!proxy->GetFunctionInfo()->HasComputedName());
        Assert(!proxy->GetFunctionInfo()->HasHomeObj());
        ScriptFunctionType* deferredPrototypeType = proxy->EnsureDeferredPrototypeType();
        return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, WasmScriptFunction, proxy, deferredPrototypeType);
    }